

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  IdlNamer *this_00;
  ushort uVar1;
  uint16_t uVar2;
  BaseType BVar3;
  BaseType BVar4;
  FieldDef *field;
  FieldDef *pFVar5;
  StructDef *pSVar6;
  Type type;
  bool bVar7;
  pointer ppFVar8;
  unsigned_long t;
  size_t t_00;
  ulong uVar9;
  Value *pVVar10;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  string params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  string qualified_name;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> setter_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> setter_parameter;
  string return_type;
  string offset_val;
  string field_type;
  FieldDef *key_field;
  pointer local_130;
  string field_default_value;
  string local_108;
  string bbgetter;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  string ucast;
  function<void_()> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string local_50;
  
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&fields_vec,&(struct_def->fields).vec);
  key_field = (FieldDef *)0x0;
  this_00 = &this->namer_;
  ppFVar8 = fields_vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar8 ==
        fields_vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if ((struct_def->has_key != false) && (struct_def->fixed == false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&qualified_name,"keysCompare",(allocator<char> *)&bbgetter);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field_name,"o1: Int, o2: Int, _bb: ByteBuffer",
                   (allocator<char> *)&ucast);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field_type,"Int",(allocator<char> *)&offset_val);
        return_type._M_dataplus._M_p = (pointer)&key_field;
        return_type._M_string_length = (size_type)writer;
        return_type.field_2._M_allocated_capacity = (size_type)this;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_18_,void>
                  ((function<void()> *)&field_default_value,(anon_class_24_3_5f35eaae *)&return_type
                  );
        GenerateOverrideFun(writer,&qualified_name,&field_name,&field_type,
                            (function<void_()> *)&field_default_value);
        std::_Function_base::~_Function_base((_Function_base *)&field_default_value);
        std::__cxx11::string::~string((string *)&field_type);
        std::__cxx11::string::~string((string *)&field_name);
        std::__cxx11::string::~string((string *)&qualified_name);
      }
      std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
      ~_Vector_base(&fields_vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   );
      return;
    }
    field = *ppFVar8;
    if (field->deprecated == false) {
      if (field->key == true) {
        key_field = field;
      }
      GenerateComment(this,&(field->super_Definition).doc_comment,writer,
                      (CommentConfig *)(anonymous_namespace)::comment_config);
      local_130 = ppFVar8;
      (*(this_00->super_Namer)._vptr_Namer[0x12])(&field_name,this_00,field);
      pVVar10 = &field->value;
      GenTypeGet_abi_cxx11_(&field_type,this,&pVVar10->type);
      GenDefaultValue_abi_cxx11_(&field_default_value,this,field,false);
      GetterReturnType_abi_cxx11_(&return_type,this,field);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"bb",(allocator<char> *)&qualified_name);
      ByteBufferGetter(&bbgetter,this,&pVVar10->type,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      type.struct_def._0_4_ = local_2e8;
      type._0_8_ = *(undefined8 *)&(field->value).type.fixed_length;
      type.struct_def._4_4_ = uStack_2e4;
      type.enum_def._0_4_ = (BaseType)params._M_dataplus._M_p;
      type.enum_def._4_4_ = params._M_dataplus._M_p._4_4_;
      type._24_8_ = params._M_string_length;
      CastToUsigned_abi_cxx11_(type);
      NumToString<unsigned_short>(&offset_val,(field->value).offset);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &qualified_name,"val o = __offset(",&offset_val);
      std::operator+(&offset_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &qualified_name,"); return o != 0 ? ");
      std::__cxx11::string::~string((string *)&qualified_name);
      BVar3 = (pVVar10->type).base_type;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"offset",(allocator<char> *)&params_1);
      NumToString<unsigned_short>(&params,(field->value).offset);
      CodeWriter::SetValue(writer,&qualified_name,&params);
      std::__cxx11::string::~string((string *)&params);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"return_type",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&return_type);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"field_type",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&field_type);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"field_name",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&field_name);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"field_default",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&field_default_value);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"bbgetter",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&bbgetter);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"ucast",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&ucast);
      std::__cxx11::string::~string((string *)&qualified_name);
      if (BVar3 == BASE_TYPE_VECTOR) {
        if ((field->value).type.element == BASE_TYPE_STRUCT) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&qualified_name,"j: Int",(allocator<char> *)&params_1);
          params._M_string_length = 0;
          params.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:960:71)>
               ::_M_invoke;
          params.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:960:71)>
               ::_M_manager;
          params._M_dataplus._M_p = (pointer)writer;
          GenerateFunOneLine(writer,&field_name,&qualified_name,&return_type,
                             (function<void_()> *)&params,false);
          std::_Function_base::~_Function_base((_Function_base *)&params);
          std::__cxx11::string::~string((string *)&qualified_name);
        }
switchD_0018eee8_caseD_e:
        qualified_name._M_dataplus._M_p._4_4_ = 0;
        qualified_name._M_dataplus._M_p._0_4_ = (field->value).type.element;
        qualified_name._M_string_length = (size_type)(field->value).type.struct_def;
        qualified_name.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
        qualified_name.field_2._8_2_ = (field->value).type.fixed_length;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"j: Int",(allocator<char> *)&params_1);
        if ((BaseType)qualified_name._M_dataplus._M_p - 0xf < 2) {
          std::operator+(&rtype,"obj: ",&field_type);
          std::operator+(&params_1,&rtype,", j: Int");
          std::__cxx11::string::operator=((string *)&params,(string *)&params_1);
          std::__cxx11::string::~string((string *)&params_1);
          std::__cxx11::string::~string((string *)&rtype);
        }
        rtype.field_2._8_8_ = &offset_val;
        rtype._M_dataplus._M_p = (pointer)&qualified_name;
        rtype._M_string_length = (size_type)field;
        rtype.field_2._M_allocated_capacity = (size_type)writer;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_8_,void>
                  ((function<void()> *)&params_1,(anon_class_32_4_f5627902 *)&rtype);
        GenerateFun(writer,&field_name,&params,&return_type,(function<void_()> *)&params_1,false);
        std::_Function_base::~_Function_base((_Function_base *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &qualified_name,&field_name,"Length");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"Int",(allocator<char> *)&rtype);
        params_1._M_string_length = (size_type)&offset_val;
        params_1.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1114:62)>
             ::_M_invoke;
        params_1.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1114:62)>
             ::_M_manager;
        params_1._M_dataplus._M_p = (pointer)writer;
        GenerateGetter(writer,&qualified_name,&params,(function<void_()> *)&params_1);
        std::_Function_base::~_Function_base((_Function_base *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&qualified_name);
        BVar4 = (field->value).type.element;
        if (BVar4 == BASE_TYPE_STRUCT) {
          pSVar6 = (field->value).type.struct_def;
          if (pSVar6->fixed != false) {
            local_2e8 = 1;
            goto LAB_0018eec1;
          }
          ppFVar8 = (pSVar6->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (ppFVar8 ==
                (pSVar6->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0018f3a4;
            pFVar5 = *ppFVar8;
            ppFVar8 = ppFVar8 + 1;
          } while (pFVar5->key != true);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&params,"",(allocator<char> *)&params_1);
          BaseGenerator::WrapInNameSpace
                    (&qualified_name,&this->super_BaseGenerator,&pSVar6->super_Definition,&params);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&params_1,"ByKey",(allocator<char> *)&rtype);
          (*(this_00->super_Namer)._vptr_Namer[3])(&params,this_00,field,&params_1);
          std::__cxx11::string::~string((string *)&params_1);
          pVVar10 = &pFVar5->value;
          GenTypeGet_abi_cxx11_(&rtype,this,&pVVar10->type);
          std::operator+(&params_1,"key: ",&rtype);
          std::__cxx11::string::~string((string *)&rtype);
          std::operator+(&rtype,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&qualified_name,"?");
          setter_parameter._M_string_length = (size_type)&offset_val;
          setter_parameter._M_dataplus._M_p = (pointer)writer;
          setter_parameter.field_2._M_allocated_capacity =
               (size_type)(anon_class_64_8_846b8abb *)&qualified_name;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_11_,void>
                    ((function<void()> *)&param2,(anon_class_24_3_aa68e553 *)&setter_parameter);
          GenerateFun(writer,&params,&params_1,&rtype,(function<void_()> *)&param2,false);
          std::_Function_base::~_Function_base((_Function_base *)&param2);
          std::operator+(&setter_index,"obj: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &qualified_name);
          std::operator+(&setter_parameter,&setter_index,", key: ");
          GenTypeGet_abi_cxx11_(&local_108,this,&pVVar10->type);
          std::operator+(&param2,&setter_parameter,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&setter_parameter);
          std::__cxx11::string::~string((string *)&setter_index);
          setter_index._M_string_length = (size_type)&offset_val;
          setter_index._M_dataplus._M_p = (pointer)writer;
          setter_index.field_2._M_allocated_capacity =
               (size_type)(anon_class_64_8_846b8abb *)&qualified_name;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_12_,void>
                    ((function<void()> *)&setter_parameter,(anon_class_24_3_aa68e553 *)&setter_index
                    );
          GenerateFun(writer,&params,&param2,&rtype,(function<void_()> *)&setter_parameter,false);
          std::_Function_base::~_Function_base((_Function_base *)&setter_parameter);
          std::__cxx11::string::~string((string *)&param2);
          std::__cxx11::string::~string((string *)&rtype);
          std::__cxx11::string::~string((string *)&params_1);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&qualified_name);
          BVar4 = (field->value).type.element;
        }
        ppFVar8 = (pointer)(ulong)BVar4;
        if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
          uVar1 = (field->value).type.fixed_length;
          uVar9 = (ulong)uVar1;
          params._M_dataplus._M_p._4_4_ = 0;
          params._M_string_length = (size_type)(field->value).type.struct_def;
          params.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
          params.field_2._8_2_ = uVar1;
          params._M_dataplus._M_p._0_4_ = BVar4;
          t = InlineSize((Type *)&params);
          local_2e8 = (undefined4)CONCAT71((int7)(uVar9 >> 8),1);
        }
        else {
LAB_0018f3a4:
          local_2e8 = (undefined4)CONCAT71((int7)((ulong)ppFVar8 >> 8),1);
          if (BVar3 != BASE_TYPE_STRING) goto LAB_0018eec1;
LAB_0018f3b5:
          t = 1;
        }
        NumToString<unsigned_long>(&qualified_name,t);
        std::operator+(&params,&field_name,"AsByteBuffer");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params_1,"ByteBuffer",(allocator<char> *)&param2);
        rtype.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1171:64)>
             ::_M_invoke;
        rtype.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1171:64)>
             ::_M_manager;
        rtype._M_dataplus._M_p = (pointer)writer;
        rtype._M_string_length = (size_type)&qualified_name;
        GenerateGetterOneLine(writer,&params,&params_1,(function<void_()> *)&rtype);
        std::_Function_base::~_Function_base((_Function_base *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::operator+(&params,&field_name,"InByteBuffer");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params_1,"_bb: ByteBuffer",(allocator<char> *)&setter_parameter);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rtype,"ByteBuffer",(allocator<char> *)&setter_index);
        param2.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1182:27)>
             ::_M_invoke;
        param2.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1182:27)>
             ::_M_manager;
        param2._M_dataplus._M_p = (pointer)writer;
        param2._M_string_length = (size_type)&qualified_name;
        GenerateFunOneLine(writer,&params,&params_1,&rtype,(function<void_()> *)&param2,false);
        std::_Function_base::~_Function_base((_Function_base *)&param2);
        std::__cxx11::string::~string((string *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&qualified_name);
        bVar7 = false;
      }
      else if (BVar3 == BASE_TYPE_STRUCT) {
        qualified_name._M_string_length = 0;
        qualified_name.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:952:64)>
             ::_M_invoke;
        qualified_name.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:952:64)>
             ::_M_manager;
        qualified_name._M_dataplus._M_p = (pointer)writer;
        GenerateGetterOneLine(writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
        std::_Function_base::~_Function_base((_Function_base *)&qualified_name);
switchD_0018eee8_caseD_f:
        if (struct_def->fixed == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &qualified_name,"obj: ",&field_type);
          params._M_string_length = 0;
          params.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:989:19)>
               ::_M_invoke;
          params.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:989:19)>
               ::_M_manager;
          params._M_dataplus._M_p = (pointer)writer;
          GenerateFunOneLine(writer,&field_name,&qualified_name,&return_type,
                             (function<void_()> *)&params,false);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &qualified_name,"obj: ",&field_type);
          params_1.field_2._M_allocated_capacity = (size_type)&offset_val;
          params_1._M_dataplus._M_p = (pointer)field;
          params_1._M_string_length = (size_type)writer;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_6_,void>
                    ((function<void()> *)&params,(anon_class_24_3_3a33afe5 *)&params_1);
          GenerateFun(writer,&field_name,&qualified_name,&return_type,(function<void_()> *)&params,
                      false);
        }
LAB_0018eea9:
        std::_Function_base::~_Function_base((_Function_base *)&params);
        std::__cxx11::string::~string((string *)&qualified_name);
        local_2e8 = 0;
LAB_0018eec1:
        bVar7 = false;
      }
      else {
        if (0xb < BVar3 - BASE_TYPE_UTYPE) {
          switch(BVar3) {
          case BASE_TYPE_STRING:
            qualified_name.field_2._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1035:61)>
                 ::_M_invoke;
            qualified_name.field_2._M_allocated_capacity =
                 (size_type)
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1035:61)>
                 ::_M_manager;
            qualified_name._M_dataplus._M_p = (pointer)writer;
            qualified_name._M_string_length = (size_type)field;
            GenerateGetter(writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
            std::_Function_base::~_Function_base((_Function_base *)&qualified_name);
            local_2e8 = 0;
            break;
          case BASE_TYPE_VECTOR:
            goto switchD_0018eee8_caseD_e;
          case BASE_TYPE_STRUCT:
            goto switchD_0018eee8_caseD_f;
          case BASE_TYPE_UNION:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &qualified_name,"obj: ",&field_type);
            params_1._M_string_length = (size_type)&offset_val;
            params_1.field_2._M_allocated_capacity = (size_type)&bbgetter;
            params_1._M_dataplus._M_p = (pointer)writer;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_9_,void>
                      ((function<void()> *)&params,(anon_class_24_3_8247fe50 *)&params_1);
            GenerateFun(writer,&field_name,&qualified_name,&return_type,(function<void_()> *)&params
                        ,false);
            goto LAB_0018eea9;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp"
                          ,0x454,
                          "void flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                         );
          }
          goto LAB_0018f3b5;
        }
        if (struct_def->fixed == true) {
          qualified_name._M_string_length = 0;
          qualified_name.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:967:66)>
               ::_M_invoke;
          qualified_name.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:967:66)>
               ::_M_manager;
          qualified_name._M_dataplus._M_p = (pointer)writer;
          GenerateGetterOneLine
                    (writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
        }
        else {
          qualified_name._M_string_length = 0;
          qualified_name.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:971:59)>
               ::_M_invoke;
          qualified_name.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:971:59)>
               ::_M_manager;
          qualified_name._M_dataplus._M_p = (pointer)writer;
          GenerateGetter(writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
        }
        std::_Function_base::~_Function_base((_Function_base *)&qualified_name);
        bVar7 = true;
        local_2e8 = 0;
      }
      pSVar6 = field->nested_flatbuffer;
      if (pSVar6 != (StructDef *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"",(allocator<char> *)&params_1);
        BaseGenerator::WrapInNameSpace
                  (&qualified_name,&this->super_BaseGenerator,&pSVar6->super_Definition,&params);
        std::__cxx11::string::~string((string *)&params);
        std::operator+(&params_1,&field_name,"As");
        std::operator+(&params,&params_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       field->nested_flatbuffer);
        std::__cxx11::string::~string((string *)&params_1);
        std::operator+(&params_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &qualified_name,"?");
        param2._M_dataplus._M_p = (pointer)writer;
        param2._M_string_length = (size_type)&params;
        param2.field_2._M_allocated_capacity =
             (size_type)(anon_class_64_8_846b8abb *)&qualified_name;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_15_,void>
                  ((function<void()> *)&rtype,(anon_class_24_3_47cc0641 *)&param2);
        GenerateGetterOneLine(writer,&params,&params_1,(function<void_()> *)&rtype);
        std::_Function_base::~_Function_base((_Function_base *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
        std::operator+(&params_1,"obj: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &qualified_name);
        std::operator+(&rtype,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &qualified_name,"?");
        param2._M_string_length = (size_type)&offset_val;
        param2.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1203:45)>
             ::_M_invoke;
        param2.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:1203:45)>
             ::_M_manager;
        param2._M_dataplus._M_p = (pointer)writer;
        GenerateFun(writer,&params,&params_1,&rtype,(function<void_()> *)&param2,false);
        std::_Function_base::~_Function_base((_Function_base *)&param2);
        std::__cxx11::string::~string((string *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&qualified_name);
      }
      if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) {
        BVar3 = (field->value).type.element;
        params._M_string_length = (size_type)(field->value).type.struct_def;
        params.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
        uVar2 = (field->value).type.fixed_length;
        if ((char)local_2e8 == '\0') {
          params._M_dataplus._M_p._0_4_ = (field->value).type.base_type;
          params.field_2._10_4_ = *(undefined4 *)&(field->value).type.field_0x1a;
          params.field_2._8_2_ = uVar2;
          params.field_2._14_2_ = *(undefined2 *)&(field->value).type.field_0x1e;
          params._M_dataplus._M_p._4_4_ = BVar3;
        }
        else {
          params._M_dataplus._M_p._4_4_ = BASE_TYPE_NONE;
          params.field_2._8_2_ = uVar2;
          params._M_dataplus._M_p._0_4_ = BVar3;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&qualified_name,"mutate",(allocator<char> *)&param2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rtype,"",(allocator<char> *)&setter_parameter);
        IdlNamer::LegacyKotlinMethod(&params_1,this_00,&qualified_name,field,&rtype);
        std::__cxx11::string::~string((string *)&rtype);
        std::__cxx11::string::~string((string *)&qualified_name);
        t_00 = InlineSize((Type *)&params);
        NumToString<unsigned_long>(&rtype,t_00);
        (*(this_00->super_Namer)._vptr_Namer[0x12])(&setter_parameter,this_00,field);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &qualified_name,&setter_parameter,": ");
        GenTypeGet_abi_cxx11_(&setter_index,this,(Type *)&params);
        std::operator+(&param2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &qualified_name,&setter_index);
        std::__cxx11::string::~string((string *)&setter_index);
        std::__cxx11::string::~string((string *)&qualified_name);
        std::__cxx11::string::~string((string *)&setter_parameter);
        if ((char)local_2e8 != '\0') {
          std::__cxx11::string::insert((ulong)&param2,(char *)0x0);
        }
        if ((BaseType)params._M_dataplus._M_p == BASE_TYPE_BOOL) {
          (*(this_00->super_Namer)._vptr_Namer[0x12])(&setter_index,this_00,field);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &qualified_name,"(if(",&setter_index);
          std::operator+(&setter_parameter,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &qualified_name,") 1 else 0).toByte()");
          std::__cxx11::string::~string((string *)&qualified_name);
          std::__cxx11::string::~string((string *)&setter_index);
        }
        else {
          (*(this_00->super_Namer)._vptr_Namer[0x12])(&setter_parameter,this_00,field);
        }
        if ((char)local_2e8 == '\0') {
          if (struct_def->fixed == true) {
            std::operator+(&setter_index,"bb_pos + ",&offset_val);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&setter_index,"o + bb_pos",(allocator<char> *)&qualified_name);
          }
          if (bVar7) goto LAB_0018f9d5;
        }
        else {
          std::operator+(&setter_index,"__vector(o) + j * ",&rtype);
          if ((bool)(bVar7 | BVar3 - BASE_TYPE_UTYPE < 0xc)) {
LAB_0018f9d5:
            qualified_name.field_2._M_allocated_capacity = (size_type)&params;
            qualified_name.field_2._8_8_ = &setter_index;
            qualified_name._M_string_length = (size_type)this;
            if (struct_def->fixed == true) {
              qualified_name._M_dataplus._M_p = (pointer)writer;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"ByteBuffer",
                         (allocator<char> *)((long)&uStack_2e4 + 3));
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_17_&,void>
                        ((function<void()> *)&local_90,(anon_class_64_8_846b8abb *)&qualified_name);
              GenerateFunOneLine(writer,&params_1,&param2,&local_108,&local_90,false);
            }
            else {
              qualified_name._M_dataplus._M_p = (pointer)writer;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"Boolean",(allocator<char> *)((long)&uStack_2e4 + 3));
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_17_&,void>
                        ((function<void()> *)&local_90,(anon_class_64_8_846b8abb *)&qualified_name);
              GenerateFun(writer,&params_1,&param2,&local_108,&local_90,false);
            }
            std::_Function_base::~_Function_base(&local_90.super__Function_base);
            std::__cxx11::string::~string((string *)&local_108);
          }
        }
        std::__cxx11::string::~string((string *)&setter_index);
        std::__cxx11::string::~string((string *)&setter_parameter);
        std::__cxx11::string::~string((string *)&param2);
        std::__cxx11::string::~string((string *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
      }
      std::__cxx11::string::~string((string *)&offset_prefix);
      std::__cxx11::string::~string((string *)&offset_val);
      std::__cxx11::string::~string((string *)&ucast);
      std::__cxx11::string::~string((string *)&bbgetter);
      std::__cxx11::string::~string((string *)&return_type);
      std::__cxx11::string::~string((string *)&field_default_value);
      std::__cxx11::string::~string((string *)&field_type);
      std::__cxx11::string::~string((string *)&field_name);
      ppFVar8 = local_130;
    }
    ppFVar8 = ppFVar8 + 1;
  } while( true );
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto ucast = CastToUsigned(field);
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = __offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      writer.SetValue("ucast", ucast);

      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            writer += "{{bbgetter}}(bb_pos + {{offset}}){{ucast}}";
          });
        } else {
          GenerateGetter(writer, field_name, return_type, [&]() {
            writer += "val o = __offset({{offset}})";
            writer +=
                "return if(o != 0) {{bbgetter}}"
                "(o + bb_pos){{ucast}} else "
                "{{field_default}}";
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.__assign(bb_pos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type,
                  [&]() { writer += "obj.__assign(bb_pos + {{offset}}, bb)"; });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = __offset(4)
              //      return if(o != 0) {
              //          obj.__assign(o + bb_pos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFun(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("o + bb_pos", fixed));
                    OffsetWrapper(
                        writer, offset_val,
                        [&]() { writer += "obj.__assign({{seek}}, bb)"; },
                        [&]() {
                          if (field.IsRequired()) {
                            writer +=
                                "throw AssertionError(\"No value for "
                                "(required) field {{field_name}}\")";
                          } else {
                            writer += "null";
                          }
                        });
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = __offset(10)
            //          return if (o != 0) {
            //              __string(o + bb_pos)
            //          } else {
            //              null
            //          }
            //     }
            // ? adds nullability annotation
            GenerateGetter(writer, field_name, return_type, [&]() {
              writer += "val o = __offset({{offset}})";
              writer += "return if (o != 0) {";
              writer.IncrementIdentLevel();
              writer += "__string(o + bb_pos)";
              writer.DecrementIdentLevel();
              writer += "} else {";
              writer.IncrementIdentLevel();
              if (field.IsRequired()) {
                writer +=
                    "throw AssertionError(\"No value for (required) field "
                    "{{field_name}}\")";
              } else {
                writer += "null";
              }
              writer.DecrementIdentLevel();
              writer += "}";
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = __offset(14)
            //     return if (o != 0) {
            //         bb.get(__vector(o) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFun(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "__vector(o) + j * " + inline_size;
              auto not_found =
                  field.IsRequired()
                      ? "throw IndexOutOfBoundsException(\"Index out of range: "
                        "$j, vector {{field_name}} is empty\")"
                      : NotFoundReturn(field.value.type.element);
              auto found = "";
              writer.SetValue("index", index);
              switch (vectortype.base_type) {
                case BASE_TYPE_STRUCT: {
                  bool fixed = vectortype.struct_def->fixed;
                  writer.SetValue("index", Indirect(index, fixed));
                  found = "obj.__assign({{index}}, bb)";
                  break;
                }
                case BASE_TYPE_UNION:
                  found = "{{bbgetter}}(obj, {{index}}){{ucast}}";
                  break;
                default: found = "{{bbgetter}}({{index}}){{ucast}}";
              }
              OffsetWrapper(
                  writer, offset_val, [&]() { writer += found; },
                  [&]() { writer += not_found; });
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFun(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += OffsetWrapperOneLine(
                      offset_val, bbgetter + "(obj, o + bb_pos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetter(writer, field_name + "Length", "Int", [&]() {
          writer += OffsetWrapperOneLine(offset_val, "__vector_len(o)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = WrapInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFun(writer, name, params, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(null, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFun(writer, name, param2, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(obj, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));
        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // val inventoryByteBuffer: ByteBuffer
        //     get =  __vector_as_bytebuffer(14, 1)

        GenerateGetterOneLine(
            writer, field_name + "AsByteBuffer", "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_as_bytebuffer({{offset}}, {{end}})";
            });

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(_bb: Bytebuffer):
        //     ByteBuffer = __vector_as_bytebuffer(_bb, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "InByteBuffer", "_bb: ByteBuffer",
            "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_in_bytebuffer(_bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = WrapInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFun(writer, nested_method_name, "obj: " + nested_type_name,
                    nested_type_name + "?", [&]() {
                      OffsetWrapper(
                          writer, offset_val,
                          [&]() {
                            writer +=
                                "obj.__assign(__indirect(__vector(o)), bb)";
                          },
                          [&]() { writer += "null"; });
                    });
      }

      // Generate mutators for scalar fields or vectors of scalars.
      if (parser_.opts.mutable_buffer) {
        auto value_type = field.value.type;
        auto underlying_type = value_base_type == BASE_TYPE_VECTOR
                                   ? value_type.VectorType()
                                   : value_type;
        auto name = namer_.LegacyKotlinMethod("mutate", field, "");
        auto size = NumToString(InlineSize(underlying_type));
        auto params = namer_.Field(field) + ": " + GenTypeGet(underlying_type);
        // A vector mutator also needs the index of the vector element it should
        // mutate.
        if (value_base_type == BASE_TYPE_VECTOR) params.insert(0, "j: Int, ");

        // Boolean parameters have to be explicitly converted to byte
        // representation.
        auto setter_parameter =
            underlying_type.base_type == BASE_TYPE_BOOL
                ? "(if(" + namer_.Field(field) + ") 1 else 0).toByte()"
                : namer_.Field(field);

        auto setter_index =
            value_base_type == BASE_TYPE_VECTOR
                ? "__vector(o) + j * " + size
                : (struct_def.fixed ? "bb_pos + " + offset_val : "o + bb_pos");
        if (IsScalar(value_base_type) ||
            (value_base_type == BASE_TYPE_VECTOR &&
             IsScalar(value_type.VectorType().base_type))) {
          auto statements = [&]() {
            writer.SetValue("bbsetter", ByteBufferSetter(underlying_type));
            writer.SetValue("index", setter_index);
            writer.SetValue("params", setter_parameter);
            writer.SetValue("cast", CastToSigned(field));
            if (struct_def.fixed) {
              writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
            } else {
              OffsetWrapper(
                  writer, offset_val,
                  [&]() {
                    writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
                    writer += "true";
                  },
                  [&]() { writer += "false"; });
            }
          };

          if (struct_def.fixed) {
            GenerateFunOneLine(writer, name, params, "ByteBuffer", statements);
          } else {
            GenerateFun(writer, name, params, "Boolean", statements);
          }
        }
      }
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare", "o1: Int, o2: Int, _bb: ByteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(__offset({{offset}}, o1, "
                  "_bb), __offset({{offset}}, o2, _bb), _bb)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "_bb", "o1");
              auto getter2 = GenLookupByKey(key_field, "_bb", "o2");
              writer += "val val_1 = " + getter1;
              writer += "val val_2 = " + getter2;
              writer += "return (val_1 - val_2).sign";
            }
          });
    }
  }